

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PhysBCFunct.H
# Opt level: O3

void __thiscall
amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>::
operator()(PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
           *this,MultiFab *mf,int icomp,int ncomp,IntVect *nghost,Real time,int bccomp)

{
  Box *domain;
  int *piVar1;
  int iVar2;
  FArrayBox *dest;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int i;
  uint uVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  pointer piVar16;
  uint uVar17;
  Box bx;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> bcrs;
  Box local_d8;
  MFIter mfi;
  
  if ((((this->m_geom).super_CoordSys.field_0x51 != '\x01') ||
      ((this->m_geom).super_CoordSys.field_0x52 != '\x01')) ||
     ((this->m_geom).super_CoordSys.field_0x53 == '\0')) {
    domain = &(this->m_geom).domain;
    uVar11 = 0;
    switch((mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_bat_type) {
    case null:
    case coarsenRatio:
      break;
    case indexType:
    case indexType_coarsenRatio:
      uVar11 = *(uint *)&(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.
                         m_op;
      break;
    default:
      uVar11 = *(uint *)((long)&(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.
                                m_bat.m_op + 4);
    }
    uVar4 = *(undefined8 *)((this->m_geom).domain.smallend.vect + 2);
    uVar5 = *(undefined8 *)((this->m_geom).domain.bigend.vect + 2);
    bx.bigend.vect[1] = (int)((ulong)*(undefined8 *)(this->m_geom).domain.bigend.vect >> 0x20);
    bx.bigend.vect[2] = (int)uVar5;
    bx.btype.itype = (uint)((ulong)uVar5 >> 0x20);
    bx.smallend.vect._0_8_ = *(undefined8 *)(domain->smallend).vect;
    bx.smallend.vect[2] = (int)uVar4;
    bx.bigend.vect[0] = (int)((ulong)uVar4 >> 0x20);
    lVar15 = 0;
    do {
      uVar17 = 1 << ((byte)lVar15 & 0x1f);
      uVar13 = (uint)lVar15;
      bx.bigend.vect[lVar15] =
           (bx.bigend.vect[lVar15] + (uint)((uVar11 >> (uVar13 & 0x1f) & 1) != 0)) -
           (uint)((bx.btype.itype >> (uVar13 & 0x1f) & 1) != 0);
      if ((uVar11 >> (uVar13 & 0x1f) & 1) == 0) {
        bx.btype.itype = ~uVar17 & bx.btype.itype;
      }
      else {
        bx.btype.itype = uVar17 | bx.btype.itype;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    lVar15 = 0;
    do {
      if (*(char *)((long)(this->m_geom).super_CoordSys.inv_dx + lVar15 + 0x19) == '\x01') {
        iVar2 = nghost->vect[lVar15];
        piVar1 = bx.smallend.vect + lVar15;
        *piVar1 = *piVar1 - iVar2;
        piVar1 = bx.bigend.vect + lVar15;
        *piVar1 = *piVar1 + iVar2;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
              (&bcrs.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,(long)ncomp,
               (allocator_type *)&mfi);
    MFIter::MFIter(&mfi,(FabArrayBase *)mf,'\0');
    iVar10 = bx.bigend.vect[2];
    iVar9 = bx.bigend.vect[1];
    iVar8 = bx.bigend.vect[0];
    iVar2 = bx.smallend.vect[2];
    if (mfi.currentIndex < mfi.endIndex) {
      iVar6 = bx.smallend.vect[0];
      iVar7 = bx.smallend.vect[1];
      do {
        lVar12 = (long)mfi.currentIndex;
        lVar15 = lVar12;
        if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          lVar15 = (long)((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar12];
        }
        dest = (mf->super_FabArray<amrex::FArrayBox>).m_fabs_v.
               super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
               super__Vector_impl_data._M_start[lVar15];
        piVar16 = ((mfi.index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        FabArrayBase::fabbox(&local_d8,mfi.fabArray,piVar16[lVar12]);
        auVar3._4_4_ = -(uint)(iVar10 < local_d8.bigend.vect[2]);
        auVar3._0_4_ = -(uint)(iVar9 < local_d8.bigend.vect[1]);
        auVar3._8_4_ = -(uint)(local_d8.smallend.vect[0] < iVar6);
        auVar3._12_4_ = -(uint)(local_d8.smallend.vect[1] < iVar7);
        iVar14 = movmskps((int)piVar16,auVar3);
        if (((iVar14 != 0) || (iVar8 < local_d8.bigend.vect[0])) ||
           (local_d8.smallend.vect[2] < iVar2)) {
          setBC(&local_d8,domain,bccomp,0,ncomp,&this->m_bcr,&bcrs);
          GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>::operator()
                    ((GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy> *)
                     &this->field_0xe0,&local_d8,dest,icomp,ncomp,&this->m_geom,time,&bcrs,0,bccomp)
          ;
        }
        MFIter::operator++(&mfi);
      } while (mfi.currentIndex < mfi.endIndex);
    }
    MFIter::~MFIter(&mfi);
    if (bcrs.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
        super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(bcrs.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                      super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)bcrs.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)bcrs.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void operator() (MultiFab& mf, int icomp, int ncomp, IntVect const& nghost,
                     Real time, int bccomp)
    {
        if (m_geom.isAllPeriodic()) return;

        BL_PROFILE("PhysBCFunct::()");

        //! create a grown domain box containing valid + periodic cells
        const Box& domain = m_geom.Domain();
        Box gdomain = amrex::convert(domain, mf.boxArray().ixType());
        for (int i = 0; i < AMREX_SPACEDIM; ++i) {
            if (m_geom.isPeriodic(i)) {
                gdomain.grow(i, nghost[i]);
            }
        }

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        {
            Vector<BCRec> bcrs(ncomp);
            for (MFIter mfi(mf); mfi.isValid(); ++mfi)
            {
                FArrayBox& dest = mf[mfi];
                const Box& bx = mfi.fabbox();

                //! if there are cells not in the valid + periodic grown box
                //! we need to fill them here
                //!
                if (!gdomain.contains(bx))
                {
                    //! Based on BCRec for the domain, we need to make BCRec for this Box
                    amrex::setBC(bx, domain, bccomp, 0, ncomp, m_bcr, bcrs);

                    //! Note that we pass 0 as starting component of bcrs.
                    m_f(bx, dest, icomp, ncomp, m_geom, time, bcrs, 0, bccomp);
                }
            }
        }
    }